

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::setAutoRepeat(QAbstractButton *this,bool autoRepeat)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  bVar1 = *(byte *)(lVar2 + 0x28c);
  if (((bVar1 & 4) == 0) != autoRepeat) {
    return;
  }
  *(byte *)(lVar2 + 0x28c) = bVar1 & 0xfb | autoRepeat << 2;
  if ((bVar1 & 0x10) != 0 && autoRepeat) {
    QBasicTimer::start(lVar2 + 0x298,(long)*(int *)(lVar2 + 0x2a0) * 1000000,1,this);
    return;
  }
  QBasicTimer::stop();
  return;
}

Assistant:

void QAbstractButton::setAutoRepeat(bool autoRepeat)
{
    Q_D(QAbstractButton);
    if (d->autoRepeat == autoRepeat)
        return;
    d->autoRepeat = autoRepeat;
    if (d->autoRepeat && d->down)
        d->repeatTimer.start(d->autoRepeatDelay, this);
    else
        d->repeatTimer.stop();
}